

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

char * preprocessor_nexttoken(Preprocessor *ctx,uint *len,Token *token)

{
  char *pcVar1;
  char *retval;
  Token *token_local;
  uint *len_local;
  Preprocessor *ctx_local;
  
  pcVar1 = _preprocessor_nexttoken(ctx,len,token);
  return pcVar1;
}

Assistant:

const char *preprocessor_nexttoken(Preprocessor *ctx, unsigned int *len,
                                   Token *token)
{
    const char *retval = _preprocessor_nexttoken(ctx, len, token);
    print_debug_token(retval, *len, *token);
    return retval;
}